

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  size_t sVar1;
  int iVar2;
  fstream fs;
  long local_220 [4];
  byte abStack_200 [496];
  
  if (argc < 2) {
    iVar2 = 0;
    processInput((istream *)&std::cin,Z80);
  }
  else {
    std::fstream::fstream(local_220);
    std::fstream::open((char *)local_220,(_Ios_Openmode)argv[1]);
    if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) == 0) {
      iVar2 = 0;
      processInput((istream *)local_220,Z80);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"could not open file: ",0x15);
      __s = argv[1];
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12a300);
      }
      else {
        sVar1 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar1);
      }
      iVar2 = -1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    }
    std::fstream::~fstream(local_220);
  }
  return iVar2;
}

Assistant:

int main(int argc, char* argv[]) {
	if (argc > 1) {
		std::fstream fs;
		fs.open(argv[1], std::fstream::in);
		if (!fs) {
			std::cerr << "could not open file: " << argv[1] << "\n";
			return -1;
		}
		return processInput(fs, Target::Z80);
	}
	else {
		return processInput(std::cin, Target::Z80);
	}
}